

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbolObject.h
# Opt level: O2

BOOL __thiscall
Js::JavascriptSymbolObject::GetDiagValueString
          (JavascriptSymbolObject *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  JavascriptSymbol *pJVar1;
  PropertyRecord *pPVar2;
  
  pJVar1 = (this->value).ptr;
  if ((pJVar1 != (JavascriptSymbol *)0x0) &&
     (pPVar2 = (pJVar1->propertyRecordUsageCache).propertyRecord.ptr,
     pPVar2 != (PropertyRecord *)0x0)) {
    StringBuilder<Memory::ArenaAllocator>::Append
              (stringBuilder,(char16 *)(pPVar2 + 1),pPVar2->byteCount >> 1);
  }
  return 1;
}

Assistant:

inline const PropertyRecord* GetValue()
        {
            if (value == nullptr)
            {
                return nullptr;
            }
            return value->GetValue();
        }